

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O0

void __thiscall rcdiscover::SocketLinux::bindToDevice(SocketLinux *this,string *device)

{
  socklen_t __optlen;
  int iVar1;
  void *__optval;
  int *piVar2;
  OperationNotPermitted *this_00;
  undefined8 uVar3;
  long in_RDI;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int __fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  SocketException *in_stack_ffffffffffffffe0;
  
  __fd = *(int *)(in_RDI + 0x20);
  __optval = (void *)std::__cxx11::string::c_str();
  __optlen = std::__cxx11::string::size();
  iVar1 = setsockopt(__fd,1,0x19,__optval,__optlen);
  if (iVar1 != -1) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 1) {
    this_00 = (OperationNotPermitted *)__cxa_allocate_exception(0x10);
    OperationNotPermitted::OperationNotPermitted(this_00);
    __cxa_throw(this_00,&OperationNotPermitted::typeinfo,
                OperationNotPermitted::~OperationNotPermitted);
  }
  uVar3 = __cxa_allocate_exception(0x38);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(__fd,in_stack_ffffffffffffff88),in_stack_ffffffffffffff80);
  __errno_location();
  SocketException::SocketException
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  __cxa_throw(uVar3,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::bindToDevice(const std::string &device)
{
  if (::setsockopt(sock_,
                   SOL_SOCKET,
                   SO_BINDTODEVICE,
                   device.c_str(),
                   static_cast<socklen_t>(device.size())) == -1)
  {
    if (errno == 1)
    {
      throw OperationNotPermitted();
    }

    throw SocketException("Error while binding to device \"" + device + "\"",
                          errno);
  }
}